

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::BiasParameter::Clear(BiasParameter *this)

{
  uint uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      if (this->filler_ == (FillerParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x509c);
        other = google::protobuf::internal::LogMessage::operator<<
                          (&local_50,"CHECK failed: filler_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,other);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
      }
      FillerParameter::Clear(this->filler_);
    }
    this->axis_ = 1;
    this->num_axes_ = 1;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void BiasParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.BiasParameter)
  if (_has_bits_[0 / 32] & 7u) {
    if (has_filler()) {
      GOOGLE_DCHECK(filler_ != NULL);
      filler_->::caffe::FillerParameter::Clear();
    }
    axis_ = 1;
    num_axes_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}